

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O3

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::SetSideOrder
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,int side,int order)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *this_00;
  long *plVar5;
  long lVar6;
  TPZCompMesh *pTVar7;
  
  iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x250))(this,0,side);
  if (-1 < iVar2) {
    iVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0x90))(this);
    if (iVar2 <= iVar3) {
      lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0xa8))(this,iVar2);
      *(char *)(lVar6 + 0x14) = (char)order;
      uVar1 = *(undefined8 *)(lVar6 + 8);
      plVar5 = (long *)(**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                              super_TPZInterpolatedElement.
                                              super_TPZInterpolationSpace.super_TPZCompEl + 0xb8))
                                 (this);
      if (plVar5 == (long *)0x0) {
        uVar4 = 1;
      }
      else {
        uVar4 = (**(code **)(*plVar5 + 0x78))(plVar5);
        if (0xff < uVar4) {
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/pzconnect.h"
                     ,0xc6);
        }
      }
      *(char *)(lVar6 + 0x15) = (char)uVar4;
      iVar2 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x260))(this,iVar2,order);
      *(int *)(lVar6 + 0x18) = iVar2;
      pTVar7 = TPZCompEl::Mesh((TPZCompEl *)this);
      TPZBlock::Set(&pTVar7->fBlock,(int)uVar1,iVar2 * uVar4,-1);
      return;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZCompElHDiv::SetSideOrder. Bad paramenter side ",0x31);
  this_00 = (ostream *)std::ostream::operator<<(&std::cerr,side);
  std::__ostream_insert<char,std::char_traits<char>>(this_00," order ",7);
  plVar5 = (long *)std::ostream::operator<<(this_00,order);
  std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
  std::ostream::put((char)plVar5);
  std::ostream::flush();
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetSideOrder(int side, int order){
	int connectaux= SideConnectLocId(0,side);
	if(connectaux<0 || connectaux > this-> NConnects()) {
		PZError << "TPZCompElHDiv::SetSideOrder. Bad paramenter side " << side << " order " << order << std::endl;
#ifdef PZ_LOG
		std::stringstream sout;
		sout << __PRETTY_FUNCTION__ << " Bad side or order " << side << " order " << order;
		LOGPZ_DEBUG(logger,sout.str())
#endif
		return;
	}
	TPZConnect &c = this->Connect(connectaux);
    c.SetOrder(order,this->fConnectIndexes[connectaux]);
    int64_t seqnum = c.SequenceNumber();
    int nvar = 1;
    TPZMaterial * mat =this-> Material();
    if(mat) nvar = mat->NStateVariables();
    c.SetNState(nvar);
    int nshape =this->NConnectShapeF(connectaux,order);
    c.SetNShape(nshape);
	this-> Mesh()->Block().Set(seqnum,nshape*nvar);
}